

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::Pipeline::ByteSizeLong(Pipeline *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Type *this_00;
  size_t sVar4;
  Type *pTVar5;
  int n;
  ulong uVar6;
  uint uVar7;
  
  uVar1 = (this->models_).super_RepeatedPtrFieldBase.current_size_;
  uVar6 = (ulong)uVar1;
  uVar7 = 0;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                          (&(this->models_).super_RepeatedPtrFieldBase,uVar7);
      sVar4 = Model::ByteSizeLong(this_00);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = uVar6 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  uVar1 = (this->names_).super_RepeatedPtrFieldBase.current_size_;
  sVar4 = uVar6 + uVar1;
  if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->names_).super_RepeatedPtrFieldBase,uVar7);
      uVar3 = (uint)pTVar5->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + pTVar5->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t Pipeline::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Pipeline)
  size_t total_size = 0;

  // repeated .CoreML.Specification.Model models = 1;
  {
    unsigned int count = this->models_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->models(i));
    }
  }

  // repeated string names = 2;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->names_size());
  for (int i = 0, n = this->names_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->names(i));
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}